

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_api_dump.cpp
# Opt level: O0

bool ApiDumpOutputXrStruct
               (XrGeneratedDispatchTable *gen_dispatch_table,XrSpaceFilterInfoBaseHeaderFB *value,
               string *prefix,string *type_string,bool is_pointer,
               vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *contents)

{
  code *pcVar1;
  void *value_00;
  XrSpaceUuidFilterInfoFB *this;
  XrSpaceFilterInfoBaseHeaderFB *gen_dispatch_table_00;
  bool bVar2;
  XrInstance pXVar3;
  invalid_argument *this_00;
  string local_1c8 [32];
  string local_1a8 [8];
  string next_prefix;
  __cxx11 local_188 [32];
  char acStack_168 [8];
  char type_string_1 [64];
  string local_120 [8];
  string type_prefix;
  XrSpaceFilterInfoBaseHeaderFB local_100 [2];
  string local_e0 [32];
  string local_c0 [32];
  XrSpaceFilterInfoBaseHeaderFB *local_a0;
  XrSpaceComponentFilterInfoFB *new_value_1;
  string local_68 [32];
  XrSpaceFilterInfoBaseHeaderFB *local_48;
  XrSpaceUuidFilterInfoFB *new_value;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *contents_local;
  string *psStack_30;
  bool is_pointer_local;
  string *type_string_local;
  string *prefix_local;
  XrSpaceFilterInfoBaseHeaderFB *value_local;
  XrGeneratedDispatchTable *gen_dispatch_table_local;
  
  new_value = (XrSpaceUuidFilterInfoFB *)contents;
  contents_local._7_1_ = is_pointer;
  psStack_30 = type_string;
  type_string_local = prefix;
  prefix_local = (string *)value;
  value_local = (XrSpaceFilterInfoBaseHeaderFB *)gen_dispatch_table;
  if (value->type == XR_TYPE_SPACE_UUID_FILTER_INFO_FB) {
    local_48 = value;
    std::__cxx11::string::string(local_68,(string *)prefix);
    std::__cxx11::string::string((string *)&new_value_1,(string *)type_string);
    gen_dispatch_table_local._7_1_ =
         ApiDumpOutputXrStruct
                   (gen_dispatch_table,(XrSpaceUuidFilterInfoFB *)value,(string *)local_68,
                    (string *)&new_value_1,(bool)(contents_local._7_1_ & 1),
                    (vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)new_value);
    std::__cxx11::string::~string((string *)&new_value_1);
    std::__cxx11::string::~string(local_68);
  }
  else if (value->type == XR_TYPE_SPACE_COMPONENT_FILTER_INFO_FB) {
    local_a0 = value;
    std::__cxx11::string::string(local_c0,(string *)prefix);
    std::__cxx11::string::string(local_e0,(string *)type_string);
    gen_dispatch_table_local._7_1_ =
         ApiDumpOutputXrStruct
                   (gen_dispatch_table,(XrSpaceComponentFilterInfoFB *)value,(string *)local_c0,
                    (string *)local_e0,(bool)(contents_local._7_1_ & 1),
                    (vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)new_value);
    std::__cxx11::string::~string(local_e0);
    std::__cxx11::string::~string(local_c0);
  }
  else {
    PointerToHexString<XrSpaceFilterInfoBaseHeaderFB>(local_100);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,type_string,prefix,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100);
    std::__cxx11::string::~string((string *)local_100);
    if ((contents_local._7_1_ & 1) == 0) {
      std::__cxx11::string::operator+=((string *)prefix,".");
    }
    else {
      std::__cxx11::string::operator+=((string *)prefix,"->");
    }
    std::__cxx11::string::string(local_120,(string *)prefix);
    std::__cxx11::string::operator+=(local_120,"type");
    this = new_value;
    if (value_local == (XrSpaceFilterInfoBaseHeaderFB *)0x0) {
      std::__cxx11::to_string(local_188,*(int *)prefix_local);
      std::
      vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
      ::emplace_back<char_const(&)[16],std::__cxx11::string&,std::__cxx11::string>
                ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                  *)this,(char (*) [16])"XrStructureType",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_188);
      std::__cxx11::string::~string((string *)local_188);
    }
    else {
      type_string_1[0x28] = '\0';
      type_string_1[0x29] = '\0';
      type_string_1[0x2a] = '\0';
      type_string_1[0x2b] = '\0';
      type_string_1[0x2c] = '\0';
      type_string_1[0x2d] = '\0';
      type_string_1[0x2e] = '\0';
      type_string_1[0x2f] = '\0';
      type_string_1[0x30] = '\0';
      type_string_1[0x31] = '\0';
      type_string_1[0x32] = '\0';
      type_string_1[0x33] = '\0';
      type_string_1[0x34] = '\0';
      type_string_1[0x35] = '\0';
      type_string_1[0x36] = '\0';
      type_string_1[0x37] = '\0';
      type_string_1[0x18] = '\0';
      type_string_1[0x19] = '\0';
      type_string_1[0x1a] = '\0';
      type_string_1[0x1b] = '\0';
      type_string_1[0x1c] = '\0';
      type_string_1[0x1d] = '\0';
      type_string_1[0x1e] = '\0';
      type_string_1[0x1f] = '\0';
      type_string_1[0x20] = '\0';
      type_string_1[0x21] = '\0';
      type_string_1[0x22] = '\0';
      type_string_1[0x23] = '\0';
      type_string_1[0x24] = '\0';
      type_string_1[0x25] = '\0';
      type_string_1[0x26] = '\0';
      type_string_1[0x27] = '\0';
      type_string_1[8] = '\0';
      type_string_1[9] = '\0';
      type_string_1[10] = '\0';
      type_string_1[0xb] = '\0';
      type_string_1[0xc] = '\0';
      type_string_1[0xd] = '\0';
      type_string_1[0xe] = '\0';
      type_string_1[0xf] = '\0';
      type_string_1[0x10] = '\0';
      type_string_1[0x11] = '\0';
      type_string_1[0x12] = '\0';
      type_string_1[0x13] = '\0';
      type_string_1[0x14] = '\0';
      type_string_1[0x15] = '\0';
      type_string_1[0x16] = '\0';
      type_string_1[0x17] = '\0';
      acStack_168[0] = '\0';
      acStack_168[1] = '\0';
      acStack_168[2] = '\0';
      acStack_168[3] = '\0';
      acStack_168[4] = '\0';
      acStack_168[5] = '\0';
      acStack_168[6] = '\0';
      acStack_168[7] = '\0';
      type_string_1[0] = '\0';
      type_string_1[1] = '\0';
      type_string_1[2] = '\0';
      type_string_1[3] = '\0';
      type_string_1[4] = '\0';
      type_string_1[5] = '\0';
      type_string_1[6] = '\0';
      type_string_1[7] = '\0';
      pcVar1 = *(code **)(value_local + 4);
      pXVar3 = FindInstanceFromDispatchTable((XrGeneratedDispatchTable *)value_local);
      (*pcVar1)(pXVar3,*(undefined4 *)prefix_local,acStack_168);
      std::
      vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
      ::emplace_back<char_const(&)[16],std::__cxx11::string&,char(&)[64]>
                ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                  *)new_value,(char (*) [16])"XrStructureType",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120,
                 (char (*) [64])acStack_168);
    }
    std::__cxx11::string::string(local_1a8,(string *)prefix);
    std::__cxx11::string::operator+=(local_1a8,"next");
    gen_dispatch_table_00 = value_local;
    value_00 = *(void **)(prefix_local + 8);
    std::__cxx11::string::string(local_1c8,local_1a8);
    bVar2 = ApiDumpDecodeNextChain
                      ((XrGeneratedDispatchTable *)gen_dispatch_table_00,value_00,
                       (string *)local_1c8,
                       (vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)new_value);
    std::__cxx11::string::~string(local_1c8);
    if (((bVar2 ^ 0xffU) & 1) != 0) {
      this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(this_00,"Invalid Operation");
      __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    }
    gen_dispatch_table_local._7_1_ = 1;
    std::__cxx11::string::~string(local_1a8);
    std::__cxx11::string::~string(local_120);
  }
  return (bool)(gen_dispatch_table_local._7_1_ & 1);
}

Assistant:

bool ApiDumpOutputXrStruct(XrGeneratedDispatchTable* gen_dispatch_table, const XrSpaceFilterInfoBaseHeaderFB* value,
                           std::string prefix, std::string type_string, bool is_pointer,
                           std::vector<std::tuple<std::string, std::string, std::string>> &contents) {
    (void)gen_dispatch_table;  // silence warning
    try {
        if (value->type == XR_TYPE_SPACE_UUID_FILTER_INFO_FB) {
            const XrSpaceUuidFilterInfoFB* new_value = reinterpret_cast<const XrSpaceUuidFilterInfoFB*>(value);
            return ApiDumpOutputXrStruct(gen_dispatch_table, new_value, prefix, type_string, is_pointer, contents);
        }
        if (value->type == XR_TYPE_SPACE_COMPONENT_FILTER_INFO_FB) {
            const XrSpaceComponentFilterInfoFB* new_value = reinterpret_cast<const XrSpaceComponentFilterInfoFB*>(value);
            return ApiDumpOutputXrStruct(gen_dispatch_table, new_value, prefix, type_string, is_pointer, contents);
        }
        // Fallback path - Just output generic information about the base struct
        contents.emplace_back(type_string, prefix, PointerToHexString(value));
        if (is_pointer) {
            prefix += "->";
        } else {
            prefix += ".";
        }
        std::string type_prefix = prefix;
        type_prefix += "type";
        if (nullptr != gen_dispatch_table) {
            char type_string[XR_MAX_STRUCTURE_NAME_SIZE] = {};
            gen_dispatch_table->StructureTypeToString(FindInstanceFromDispatchTable(gen_dispatch_table),
                                                      value->type, type_string);
            contents.emplace_back("XrStructureType", type_prefix, type_string);
        } else {
                        contents.emplace_back("XrStructureType", type_prefix, std::to_string(value->type));
        }
        std::string next_prefix = prefix;
        next_prefix += "next";
        // Decode the next chain if it exists
        if (!ApiDumpDecodeNextChain(gen_dispatch_table, value->next, next_prefix, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        return true;
    } catch(...) {
    }
    return false;
}